

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::DumpHeader(Func *this)

{
  uint32 uVar1;
  Func *this_local;
  
  Output::Print(L"-----------------------------------------------------------------------------\n");
  DumpFullFunctionName(this);
  Output::SkipToColumn(0x32);
  uVar1 = GetInstrCount(this);
  Output::Print(L"Instr Count:%d",(ulong)uVar1);
  if (this->m_codeSize < 1) {
    Output::Print(L"\n\n");
  }
  else {
    Output::Print(L"\t\tSize:%d\n\n",this->m_codeSize);
  }
  return;
}

Assistant:

void
Func::DumpHeader()
{
    Output::Print(_u("-----------------------------------------------------------------------------\n"));

    DumpFullFunctionName();

    Output::SkipToColumn(50);
    Output::Print(_u("Instr Count:%d"), GetInstrCount());

    if(m_codeSize > 0)
    {
        Output::Print(_u("\t\tSize:%d\n\n"), m_codeSize);
    }
    else
    {
        Output::Print(_u("\n\n"));
    }
}